

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table_test.cc
# Opt level: O0

void __thiscall StackTraceTableTestHelper::AddTrace(StackTraceTableTestHelper *this,StackTrace *t)

{
  Entry *this_00;
  pointer pEVar1;
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  local_20;
  EntryPtr e;
  StackTrace *t_local;
  StackTraceTableTestHelper *this_local;
  
  e._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
        )(__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
          )t;
  this_00 = (Entry *)operator_new(0x110);
  Entry::Entry(this_00,(StackTrace *)
                       e._M_t.
                       super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                       .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>.
                       _M_head_impl);
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,std::default_delete<StackTraceTableTestHelper::Entry>>
  ::unique_ptr<std::default_delete<StackTraceTableTestHelper::Entry>,void>
            ((unique_ptr<StackTraceTableTestHelper::Entry,std::default_delete<StackTraceTableTestHelper::Entry>>
              *)&local_20,this_00);
  pEVar1 = std::
           unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           ::operator->(&local_20);
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::swap(&this->head_,&pEVar1->next);
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::swap(&this->head_,&local_20);
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

void AddTrace(const StackTrace& t) {
    EntryPtr e{new Entry{t}};
    head_.swap(e->next);
    head_.swap(e);
  }